

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall
chrono::ChAssembly::AddOtherPhysicsItem(ChAssembly *this,shared_ptr<chrono::ChPhysicsItem> *item)

{
  element_type *peVar1;
  long lVar2;
  __normal_iterator<std::shared_ptr<chrono::ChPhysicsItem>_*,_std::vector<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>_>
  _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  
  peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar5 = true;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChBody::typeinfo,0);
    bVar5 = lVar2 == 0;
  }
  if (bVar5) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var4 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
  }
  if (bVar5) {
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      bVar5 = true;
    }
    else {
      lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChLinkBase::typeinfo,0);
      bVar5 = lVar2 == 0;
    }
    if (bVar5) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var4 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
    }
    if (bVar5) {
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        bVar5 = true;
      }
      else {
        lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&fea::ChMesh::typeinfo,0);
        bVar5 = lVar2 == 0;
      }
      if (bVar5) {
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var4 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
      }
      if (bVar5) {
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChPhysicsItem>*,std::vector<std::shared_ptr<chrono::ChPhysicsItem>,std::allocator<std::shared_ptr<chrono::ChPhysicsItem>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChPhysicsItem>const>>
                          ((this->otherphysicslist).
                           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->otherphysicslist).
                           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,item);
        if (_Var3._M_current ==
            (this->otherphysicslist).
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          (*(peVar1->super_ChObj)._vptr_ChObj[6])(peVar1,(this->super_ChPhysicsItem).system);
          std::
          vector<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
          ::push_back(&this->otherphysicslist,item);
          ((this->super_ChPhysicsItem).system)->is_updated = false;
          return;
        }
        __assert_fail("std::find(std::begin(otherphysicslist), std::end(otherphysicslist), item) == otherphysicslist.end()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                      ,0xeb,
                      "void chrono::ChAssembly::AddOtherPhysicsItem(std::shared_ptr<ChPhysicsItem>)"
                     );
      }
      __assert_fail("!std::dynamic_pointer_cast<ChMesh>(item)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                    ,0xea,
                    "void chrono::ChAssembly::AddOtherPhysicsItem(std::shared_ptr<ChPhysicsItem>)");
    }
    __assert_fail("!std::dynamic_pointer_cast<ChLinkBase>(item)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                  ,0xe9,
                  "void chrono::ChAssembly::AddOtherPhysicsItem(std::shared_ptr<ChPhysicsItem>)");
  }
  __assert_fail("!std::dynamic_pointer_cast<ChBody>(item)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                ,0xe8,"void chrono::ChAssembly::AddOtherPhysicsItem(std::shared_ptr<ChPhysicsItem>)"
               );
}

Assistant:

void ChAssembly::AddOtherPhysicsItem(std::shared_ptr<ChPhysicsItem> item) {
    assert(!std::dynamic_pointer_cast<ChBody>(item));
    assert(!std::dynamic_pointer_cast<ChLinkBase>(item));
    assert(!std::dynamic_pointer_cast<ChMesh>(item));
    assert(std::find(std::begin(otherphysicslist), std::end(otherphysicslist), item) == otherphysicslist.end());
    // assert(item->GetSystem()==nullptr); // should remove from other system before adding here

    // set system and also add collision models to system
    item->SetSystem(system);
    otherphysicslist.push_back(item);

	////system->is_initialized = false;  // Not needed, unless/until ChPhysicsItem::SetupInitial does something
    system->is_updated = false;
}